

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2CapturedGroupTest(void)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  bool bVar3;
  int n;
  long lVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this;
  const_iterator cVar5;
  undefined1 *puVar6;
  _Rb_tree_header *p_Var7;
  allocator local_369;
  LogMessageFatal local_368;
  Arg arg3;
  Arg arg2;
  Arg arg1;
  Arg arg0;
  string args [4];
  Arg *matches [4];
  RE2 re;
  
  RE2::RE2(&re,"directions from (?P<S>.*) to (?P<D>.*)");
  n = RE2::NumberOfCapturingGroups(&re);
  if (n != 2) {
    LogMessageFatal::LogMessageFatal
              (&local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x227);
    std::operator<<((ostream *)&local_368.super_LogMessage.str_,"Check failed: (2) == (num_groups)")
    ;
    LogMessageFatal::~LogMessageFatal(&local_368);
  }
  lVar4 = 0x10;
  do {
    puVar6 = (undefined1 *)((long)&args[0]._M_dataplus._M_p + lVar4);
    *(undefined1 **)((long)args + lVar4 + -0x10) = puVar6;
    *(undefined8 *)((long)args + lVar4 + -8) = 0;
    *puVar6 = 0;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x90);
  arg0.arg_ = args;
  matches[0] = &arg0;
  arg0.parser_ = RE2::Arg::parse_string;
  arg1.arg_ = args + 1;
  matches[1] = &arg1;
  arg1.parser_ = RE2::Arg::parse_string;
  arg2.arg_ = args + 2;
  matches[2] = &arg2;
  arg2.parser_ = RE2::Arg::parse_string;
  arg3.arg_ = args + 3;
  matches[3] = &arg3;
  arg3.parser_ = RE2::Arg::parse_string;
  local_368.super_LogMessage._0_8_ = "directions from mountain view to san jose";
  local_368.super_LogMessage._8_4_ = 0x29;
  bVar3 = RE2::FullMatchN((StringPiece *)&local_368,&re,matches,n);
  if (!bVar3) {
    LogMessageFatal::LogMessageFatal
              (&local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x230);
    std::operator<<((ostream *)&local_368.super_LogMessage.str_,
                    "Check failed: RE2::FullMatchN(\"directions from mountain view to san jose\", re, matches, num_groups)"
                   );
    LogMessageFatal::~LogMessageFatal(&local_368);
  }
  this = &RE2::NamedCapturingGroups_abi_cxx11_(&re)->_M_t;
  std::__cxx11::string::string((string *)&local_368,"S",&local_369);
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)&local_368);
  p_Var7 = &(this->_M_impl).super__Rb_tree_header;
  std::__cxx11::string::~string((string *)&local_368);
  if ((_Rb_tree_header *)cVar5._M_node == p_Var7) {
    LogMessageFatal::LogMessageFatal
              (&local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x232);
    std::operator<<((ostream *)&local_368.super_LogMessage.str_,
                    "Check failed: named_groups.find(\"S\") != named_groups.end()");
    LogMessageFatal::~LogMessageFatal(&local_368);
  }
  std::__cxx11::string::string((string *)&local_368,"D",&local_369);
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  if ((_Rb_tree_header *)cVar5._M_node == p_Var7) {
    LogMessageFatal::LogMessageFatal
              (&local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x233);
    std::operator<<((ostream *)&local_368.super_LogMessage.str_,
                    "Check failed: named_groups.find(\"D\") != named_groups.end()");
    LogMessageFatal::~LogMessageFatal(&local_368);
  }
  std::__cxx11::string::string((string *)&local_368,"S",&local_369);
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)&local_368);
  _Var1 = cVar5._M_node[2]._M_color;
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::string((string *)&local_368,"D",&local_369);
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(this,(key_type *)&local_368);
  _Var2 = cVar5._M_node[2]._M_color;
  std::__cxx11::string::~string((string *)&local_368);
  if (_Var1 != _S_black) {
    LogMessageFatal::LogMessageFatal
              (&local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x238);
    std::operator<<((ostream *)&local_368.super_LogMessage.str_,
                    "Check failed: (1) == (source_group_index)");
    LogMessageFatal::~LogMessageFatal(&local_368);
  }
  if (_Var2 != 2) {
    LogMessageFatal::LogMessageFatal
              (&local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x239);
    std::operator<<((ostream *)&local_368.super_LogMessage.str_,
                    "Check failed: (2) == (destination_group_index)");
    LogMessageFatal::~LogMessageFatal(&local_368);
  }
  bVar3 = std::operator==("mountain view",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (&arg1 + (long)(int)_Var1 * 2));
  if (!bVar3) {
    LogMessageFatal::LogMessageFatal
              (&local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x23c);
    std::operator<<((ostream *)&local_368.super_LogMessage.str_,
                    "Check failed: (\"mountain view\") == (args[source_group_index - 1])");
    LogMessageFatal::~LogMessageFatal(&local_368);
  }
  bVar3 = std::operator==("san jose",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (&arg1 + (long)(int)_Var2 * 2));
  if (!bVar3) {
    LogMessageFatal::LogMessageFatal
              (&local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x23d);
    std::operator<<((ostream *)&local_368.super_LogMessage.str_,
                    "Check failed: (\"san jose\") == (args[destination_group_index - 1])");
    LogMessageFatal::~LogMessageFatal(&local_368);
  }
  lVar4 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&args[0]._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  RE2::~RE2(&re);
  return;
}

Assistant:

TEST(RE2, CapturedGroupTest) {
  RE2 re("directions from (?P<S>.*) to (?P<D>.*)");
  int num_groups = re.NumberOfCapturingGroups();
  EXPECT_EQ(2, num_groups);
  string args[4];
  RE2::Arg arg0(&args[0]);
  RE2::Arg arg1(&args[1]);
  RE2::Arg arg2(&args[2]);
  RE2::Arg arg3(&args[3]);

  const RE2::Arg* const matches[4] = {&arg0, &arg1, &arg2, &arg3};
  EXPECT_TRUE(RE2::FullMatchN("directions from mountain view to san jose",
                              re, matches, num_groups));
  const map<string, int>& named_groups = re.NamedCapturingGroups();
  EXPECT_TRUE(named_groups.find("S") != named_groups.end());
  EXPECT_TRUE(named_groups.find("D") != named_groups.end());

  // The named group index is 1-based.
  int source_group_index = named_groups.find("S")->second;
  int destination_group_index = named_groups.find("D")->second;
  EXPECT_EQ(1, source_group_index);
  EXPECT_EQ(2, destination_group_index);

  // The args is zero-based.
  EXPECT_EQ("mountain view", args[source_group_index - 1]);
  EXPECT_EQ("san jose", args[destination_group_index - 1]);
}